

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O2

DdNode * Cudd_bddAdjPermuteX(DdManager *dd,DdNode *B,DdNode **x,int n)

{
  uint uVar1;
  DdHalfWord DVar2;
  DdHalfWord DVar3;
  int *permut;
  ulong uVar4;
  DdNode *pDVar5;
  long lVar6;
  ulong uVar7;
  
  uVar1 = dd->size;
  permut = (int *)malloc((long)(int)uVar1 * 4);
  if (permut == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    pDVar5 = (DdNode *)0x0;
  }
  else {
    uVar4 = 0;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar4;
    }
    for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      permut[uVar4] = (int)uVar4;
    }
    for (lVar6 = 0; lVar6 < n + -2; lVar6 = lVar6 + 3) {
      DVar2 = x[lVar6]->index;
      DVar3 = x[lVar6 + 1]->index;
      permut[(int)DVar2] = DVar3;
      permut[(int)DVar3] = DVar2;
    }
    pDVar5 = Cudd_bddPermute(dd,B,permut);
    free(permut);
  }
  return pDVar5;
}

Assistant:

DdNode *
Cudd_bddAdjPermuteX(
  DdManager * dd,
  DdNode * B,
  DdNode ** x,
  int  n)
{
    DdNode *swapped;
    int  i, j, k;
    int  *permut;

    permut = ABC_ALLOC(int,dd->size);
    if (permut == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < dd->size; i++) permut[i] = i;
    for (i = 0; i < n-2; i += 3) {
        j = x[i]->index;
        k = x[i+1]->index;
        permut[j] = k;
        permut[k] = j;
    }

    swapped = Cudd_bddPermute(dd,B,permut);
    ABC_FREE(permut);

    return(swapped);

}